

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IexBaseExc.cpp
# Opt level: O1

void __thiscall Iex::BaseExc::BaseExc(BaseExc *this,char *s)

{
  size_t sVar1;
  
  if (s == (char *)0x0) {
    s = "";
  }
  (this->super_string)._M_dataplus._M_p = (pointer)&(this->super_string).field_2;
  sVar1 = strlen(s);
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->super_string,s,s + sVar1);
  *(undefined ***)this = &PTR__BaseExc_00159d58;
  if ((anonymous_namespace)::currentStackTracer_abi_cxx11_ == (code *)0x0) {
    (this->_stackTrace)._M_dataplus._M_p = (pointer)&(this->_stackTrace).field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&this->_stackTrace,"");
  }
  else {
    (*(anonymous_namespace)::currentStackTracer_abi_cxx11_)();
  }
  return;
}

Assistant:

BaseExc::BaseExc (const char* s) throw () :
    std::string (s? s: ""),
    _stackTrace (currentStackTracer? currentStackTracer(): "")
{
    // empty
}